

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O0

wchar_t effect_subtype(wchar_t index,char *type)

{
  _Bool _Var1;
  wchar_t wVar2;
  int iVar3;
  long lVar4;
  wchar_t local_2c;
  long lv;
  char *pe;
  char *type_local;
  wchar_t index_local;
  
  pe = type;
  type_local._0_4_ = index;
  lVar4 = strtol(type,(char **)&lv,10);
  if ((char *)lv != pe) {
    _Var1 = contains_only_spaces((char *)lv);
    if (((_Var1) && (lVar4 < 0x7fffffff)) && (-0x80000000 < lVar4)) {
      local_2c = (wchar_t)lVar4;
    }
    else {
      local_2c = L'\xffffffff';
    }
    return local_2c;
  }
  switch((wchar_t)type_local) {
  case L'\x06':
    iVar3 = strcmp(pe,"INC_BY");
    if (iVar3 == 0) {
      return L'\0';
    }
    iVar3 = strcmp(pe,"DEC_BY");
    if (iVar3 == 0) {
      return L'\x01';
    }
    iVar3 = strcmp(pe,"SET_TO");
    if (iVar3 == 0) {
      return L'\x02';
    }
    iVar3 = strcmp(pe,"INC_TO");
    if (iVar3 == 0) {
      return L'\x03';
    }
    break;
  default:
    iVar3 = strcmp(pe,"NONE");
    if (iVar3 == 0) {
      return L'\0';
    }
    break;
  case L'\b':
  case L'\t':
  case L'\n':
  case L'\v':
  case L'\r':
    wVar2 = timed_name_to_idx(pe);
    return wVar2;
  case L'\f':
    wVar2 = mon_timed_name_to_idx(pe);
    return wVar2;
  case L'\x0e':
    iVar3 = strcmp(pe,"WARDING");
    if (iVar3 == 0) {
      return L'\x01';
    }
    iVar3 = strcmp(pe,"DECOY");
    if (iVar3 == 0) {
      return L'\x02';
    }
    break;
  case L'\x10':
  case L'\x11':
  case L'\x12':
  case L'\x13':
    wVar2 = stat_name_to_idx(pe);
    return wVar2;
  case L'\x18':
    iVar3 = strcmp(pe,"SPECIAL");
    if (iVar3 == 0) {
      return L'\x01';
    }
    break;
  case L'1':
    iVar3 = strcmp(pe,"TOBOTH");
    if (iVar3 == 0) {
      return L'\x03';
    }
    iVar3 = strcmp(pe,"TOHIT");
    if (iVar3 == 0) {
      return L'\x01';
    }
    iVar3 = strcmp(pe,"TODAM");
    if (iVar3 == 0) {
      return L'\x02';
    }
    iVar3 = strcmp(pe,"TOAC");
    if (iVar3 == 0) {
      return L'\x04';
    }
    break;
  case L'3':
  case L'4':
  case L'@':
  case L'I':
  case L'J':
  case L'K':
  case L'L':
  case L'M':
  case L'N':
  case L'O':
  case L'P':
  case L'Q':
  case L'R':
  case L'S':
  case L'T':
  case L'U':
  case L'X':
  case L'Y':
  case L'Z':
  case L'[':
  case L'\\':
  case L']':
  case L'^':
  case L'_':
  case L'`':
  case L'a':
  case L'b':
  case L'q':
    wVar2 = proj_name_to_idx(pe);
    return wVar2;
  case L'7':
    wVar2 = summon_name_to_idx(pe);
    return wVar2;
  case L';':
    iVar3 = strcmp(pe,"AWAY");
    if (iVar3 == 0) {
      return L'\x01';
    }
    break;
  case L'<':
    iVar3 = strcmp(pe,"SELF");
    if (iVar3 == 0) {
      return L'\x01';
    }
    break;
  case L'A':
    iVar3 = strcmp(pe,"TARGETED");
    if (iVar3 == 0) {
      return L'\x01';
    }
    iVar3 = strcmp(pe,"NONE");
    if (iVar3 == 0) {
      return L'\0';
    }
    break;
  case L'k':
  case L'x':
    wVar2 = shape_name_to_idx(pe);
    return wVar2;
  }
  return L'\xffffffff';
}

Assistant:

int effect_subtype(int index, const char *type)
{
	char *pe;
	long lv;

	lv = strtol(type, &pe, 10);
	if (pe != type) {
		/*
		 * Got a plain numeric value.  Verify that there isn't garbage
		 * after it and that it doesn't overflow.  Also reject INT_MIN
		 * and INT_MAX so don't have to check errno to detect overflow
		 * when sizeof(long) == sizeof(int).
		 */
		return (contains_only_spaces(pe) && lv < INT_MAX
			&& lv > INT_MIN) ? (int)lv : -1;
	}
	/* If not a numerical value, assign according to effect index */
	switch (index) {
		/* Projection name */
		case EF_PROJECT_LOS:
		case EF_PROJECT_LOS_AWARE:
		case EF_DESTRUCTION:
		case EF_SPOT:
		case EF_SPHERE:
		case EF_ZONE:
		case EF_BALL:
		case EF_CLOUD:
		case EF_BREATH:
		case EF_ARC:
		case EF_SHORT_BEAM:
		case EF_LASH:
		case EF_SWARM:
		case EF_STRIKE:
		case EF_STAR:
		case EF_STAR_BALL:
		case EF_CHAIN:
		case EF_BOLT:
		case EF_BEAM:
		case EF_BOLT_OR_BEAM:
		case EF_LINE:
		case EF_ALTER:
		case EF_BOLT_STATUS:
		case EF_BOLT_STATUS_DAM:
		case EF_BOLT_AWARE:
		case EF_MELEE_BLOWS:
		case EF_TOUCH:
		case EF_TOUCH_AWARE:
			return proj_name_to_idx(type);

		/* Timed effect name */
		case EF_CURE:
		case EF_TIMED_SET:
		case EF_TIMED_INC:
		case EF_TIMED_INC_NO_RES:
		case EF_TIMED_DEC:
			return timed_name_to_idx(type);

		/* Nourishment types */
		case EF_NOURISH:
			if (streq(type, "INC_BY")) {
				return 0;
			} else if (streq(type, "DEC_BY")) {
				return 1;
			} else if (streq(type, "SET_TO")) {
				return 2;
			} else if (streq(type, "INC_TO")) {
				return 3;
			}
			break;

		/* Monster timed effect name */
		case EF_MON_TIMED_INC:
			return mon_timed_name_to_idx(type);

		/* Summon name */
		case EF_SUMMON:
			return summon_name_to_idx(type);

		/* Stat name */
		case EF_RESTORE_STAT:
		case EF_DRAIN_STAT:
		case EF_LOSE_RANDOM_STAT:
		case EF_GAIN_STAT:
			return stat_name_to_idx(type);

		/* Enchant type name - not worth a separate function */
		case EF_ENCHANT:
			if (streq(type, "TOBOTH")) {
				return ENCH_TOBOTH;
			} else if (streq(type, "TOHIT")) {
				return ENCH_TOHIT;
			} else if (streq(type, "TODAM")) {
				return ENCH_TODAM;
			} else if (streq(type, "TOAC")) {
				return ENCH_TOAC;
			}
			break;

		/* Player shape name */
		case EF_SHAPECHANGE:
		case EF_DRAGON: {
			return shape_name_to_idx(type);
		}

		/* Targeted earthquake */
		case EF_EARTHQUAKE:
			if (streq(type, "TARGETED")) {
				return 1;
			} else if (streq(type, "NONE")) {
				return 0;
			}
			break;

		/* Inscribe a glyph */
		case EF_GLYPH:
			if (streq(type, "WARDING")) {
				return GLYPH_WARDING;
			} else if (streq(type, "DECOY")) {
				return GLYPH_DECOY;
			}
			break;

		/* Allow teleport away */
		case EF_TELEPORT:
			if (streq(type, "AWAY")) {
				return 1;
			}
			break;

		/* Allow monster teleport toward */
		case EF_TELEPORT_TO:
			if (streq(type, "SELF")) {
				return 1;
			}
			break;

		/* Restrict mana restoration */
		case EF_RESTORE_MANA: {
			if (streq(type, "SPECIAL"))
				return 1;
			break;
		}

		/* Some effects only want a radius, so this is a dummy */
		default:
			if (streq(type, "NONE")) {
				return 0;
			}
			break;
	}

	return -1;
}